

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QConfFile_*>_>::moveFromSpan
          (Span<QHashPrivate::Node<QString,_QConfFile_*>_> *this,
          Span<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *fromSpan,size_t fromIndex,size_t to)

{
  uchar *puVar1;
  undefined8 *puVar2;
  byte bVar3;
  long lVar4;
  Entry *pEVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  
  if (this[0x89] == this[0x88]) {
    addStorage(this);
  }
  this[to] = this[0x89];
  lVar4 = *(long *)(this + 0x80);
  lVar9 = (ulong)(byte)this[0x89] * 0x20;
  this[0x89] = *(Span<QHashPrivate::Node<QString,_QConfFile_*>_> *)(lVar4 + lVar9);
  bVar3 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar5 = fromSpan->entries;
  lVar10 = (ulong)bVar3 * 0x20;
  puVar1 = (pEVar5->storage).data + lVar10;
  uVar6 = *(undefined8 *)puVar1;
  uVar7 = *(undefined8 *)(puVar1 + 8);
  puVar1 = (pEVar5->storage).data + lVar10 + 0x10;
  uVar8 = *(undefined8 *)(puVar1 + 8);
  puVar2 = (undefined8 *)(lVar4 + 0x10 + lVar9);
  *puVar2 = *(undefined8 *)puVar1;
  puVar2[1] = uVar8;
  *(undefined8 *)(lVar4 + lVar9) = uVar6;
  ((undefined8 *)(lVar4 + lVar9))[1] = uVar7;
  (pEVar5->storage).data[lVar10] = fromSpan->nextFree;
  fromSpan->nextFree = bVar3;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }